

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O3

bool __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::ekfUpdate(DiscreteExtendedKalmanFilterHelper *this)

{
  VectorDynSize *pVVar1;
  double *pdVar2;
  double dVar3;
  MatrixDynSize *pMVar4;
  Index index_2;
  ulong uVar5;
  long lVar6;
  PointerType pdVar7;
  long lVar8;
  PointerType pdVar9;
  ulong uVar10;
  ulong uVar11;
  Index index_1;
  Index index;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  Index size;
  type tmp;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> K;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> S;
  VectorDynSize z;
  assign_op<double,_double> local_1c1;
  VectorDynSize *local_1c0;
  MatrixDynSize *local_1b8;
  long local_1b0;
  long local_1a8;
  PointerType local_1a0;
  Matrix<double,__1,_1,_0,__1,_1> local_198;
  undefined8 local_188;
  undefined8 local_178;
  long local_170;
  PointerType local_168;
  ulong local_160;
  undefined1 local_158 [16];
  long local_148;
  long local_140;
  PointerType local_138;
  long local_130;
  long local_128;
  long local_120;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_118;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_f8;
  VectorDynSize local_d8 [32];
  undefined1 local_b8 [32];
  variable_if_dynamic<long,__1> local_98;
  variable_if_dynamic<long,__1> vStack_90;
  variable_if_dynamic<long,__1> local_88;
  undefined1 local_80 [16];
  variable_if_dynamic<long,__1> vStack_70;
  variable_if_dynamic<long,__1> local_68;
  undefined8 local_60;
  PointerType local_58;
  variable_if_dynamic<long,__1> local_50;
  variable_if_dynamic<long,__1> local_48;
  
  if (this->m_is_initialized == false) {
    pcVar13 = "filter not initialized.";
  }
  else if (this->m_initial_state_set == false) {
    pcVar13 = "initial state not set.";
  }
  else if (this->m_initial_state_covariance_set == false) {
    pcVar13 = "initial state covariance not set.";
  }
  else {
    if (this->m_measurement_updated != false) {
      iDynTree::VectorDynSize::VectorDynSize(local_d8);
      iDynTree::VectorDynSize::resize((ulong)local_d8);
      pVVar1 = &this->m_xhat;
      (*this->_vptr_DiscreteExtendedKalmanFilterHelper[1])(this,pVVar1,local_d8);
      (*this->_vptr_DiscreteExtendedKalmanFilterHelper[4])(this,pVVar1,&this->m_H);
      local_1c0 = pVVar1;
      local_1b8 = &this->m_H;
      uVar5 = iDynTree::MatrixDynSize::data();
      local_120 = iDynTree::MatrixDynSize::rows();
      lVar6 = iDynTree::MatrixDynSize::cols();
      local_1a0 = (PointerType)iDynTree::MatrixDynSize::data();
      local_1a8 = iDynTree::MatrixDynSize::rows();
      local_1b0 = iDynTree::MatrixDynSize::cols();
      pdVar7 = (PointerType)iDynTree::MatrixDynSize::data();
      lVar8 = iDynTree::MatrixDynSize::rows();
      local_f8.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = iDynTree::MatrixDynSize::cols();
      local_128 = lVar6;
      local_f8.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pdVar7;
      local_f8.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = lVar8;
      pdVar7 = (PointerType)iDynTree::MatrixDynSize::data();
      pdVar9 = (PointerType)iDynTree::MatrixDynSize::rows();
      local_118.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = iDynTree::MatrixDynSize::cols();
      local_118.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pdVar7;
      local_118.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)pdVar9;
      pdVar7 = (PointerType)iDynTree::MatrixDynSize::data();
      local_130 = iDynTree::MatrixDynSize::rows();
      local_1b8 = (MatrixDynSize *)iDynTree::MatrixDynSize::cols();
      local_138 = (PointerType)iDynTree::MatrixDynSize::data();
      local_140 = iDynTree::MatrixDynSize::rows();
      local_148 = iDynTree::MatrixDynSize::cols();
      uVar10 = iDynTree::VectorDynSize::data();
      uVar11 = iDynTree::VectorDynSize::size();
      local_158._8_8_ = iDynTree::VectorDynSize::data();
      local_1c0 = (VectorDynSize *)iDynTree::VectorDynSize::size();
      local_158._0_8_ = iDynTree::VectorDynSize::data();
      local_168 = (PointerType)iDynTree::VectorDynSize::size();
      local_160 = uVar11;
      local_170 = iDynTree::VectorDynSize::data();
      local_178 = iDynTree::VectorDynSize::size();
      lVar6 = local_130;
      pMVar4 = local_1b8;
      local_b8._8_8_ = local_130;
      local_b8._16_8_ = local_1b8;
      local_98.m_value = (long)local_1a0;
      vStack_90.m_value = local_1a8;
      local_88.m_value = local_1b0;
      vStack_70.m_value = local_130;
      local_68.m_value = (long)local_1b8;
      local_58 = local_138;
      local_50.m_value = local_140;
      local_48.m_value = local_148;
      local_b8._0_8_ = pdVar7;
      local_80._8_8_ = pdVar7;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,0>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>,0>const,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>,Eigen::internal::assign_op<double,double>>
                (&local_f8,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)local_b8,(assign_op<double,_double> *)&local_198);
      local_b8._0_8_ = local_1a0;
      local_b8._8_8_ = local_1a8;
      local_b8._16_8_ = local_1b0;
      vStack_90.m_value = lVar6;
      local_88.m_value = (long)pMVar4;
      local_80._8_8_ =
           local_f8.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
      vStack_70.m_value =
           local_f8.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_68.m_value =
           local_f8.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_98.m_value = (long)pdVar7;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>,0>,Eigen::Inverse<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>,0>,Eigen::internal::assign_op<double,double>>
                (&local_118,
                 (Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_Eigen::Inverse<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
                  *)local_b8,(assign_op<double,_double> *)&local_198,(type)0x0);
      local_b8._0_8_ = local_1a0;
      local_b8._8_8_ = local_1a8;
      local_b8._16_8_ = local_1b0;
      local_98.m_value =
           (long)local_118.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data;
      vStack_90.m_value =
           local_118.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_88.m_value =
           local_118.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      vStack_70.m_value = lVar6;
      local_68.m_value = (long)pMVar4;
      local_58 = local_1a0;
      local_50.m_value = local_1a8;
      local_48.m_value = local_1b0;
      local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      local_188 = 0;
      local_80._8_8_ = pdVar7;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,0>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,0>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_198,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>_>
                  *)local_b8);
      uVar11 = local_160;
      pdVar7 = local_168;
      uVar15 = local_128 * local_120;
      uVar12 = uVar15;
      if (((uVar5 & 7) == 0) &&
         (uVar12 = (ulong)((uint)(uVar5 >> 3) & 1), (long)uVar15 <= (long)uVar12)) {
        uVar12 = uVar15;
      }
      lVar6 = uVar15 - uVar12;
      if (0 < (long)uVar12) {
        uVar14 = 0;
        do {
          *(double *)(uVar5 + uVar14 * 8) =
               local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
      }
      lVar8 = (lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      if (1 < lVar6) {
        do {
          dVar3 = (local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data + uVar12)[1];
          pdVar2 = (double *)(uVar5 + uVar12 * 8);
          *pdVar2 = local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar12];
          pdVar2[1] = dVar3;
          uVar12 = uVar12 + 2;
        } while ((long)uVar12 < lVar8);
      }
      if (lVar8 < (long)uVar15) {
        do {
          *(double *)(uVar5 + lVar8 * 8) =
               local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (uVar15 - lVar8 != 0);
      }
      free(local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          );
      local_b8._0_8_ = local_158._8_8_;
      local_b8._8_8_ = local_1c0;
      local_b8._24_8_ =
           local_118.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
      local_98.m_value =
           local_118.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      vStack_90.m_value =
           local_118.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_80._0_8_ = local_158._0_8_;
      local_80._8_8_ = pdVar7;
      local_68.m_value = local_170;
      local_60 = local_178;
      local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      Eigen::internal::
      assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
      ::
      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>,0>const>,Eigen::internal::assign_op<double,double>>
                (&local_198,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
                  *)local_b8,&local_1c1);
      uVar12 = uVar11;
      if (((uVar10 & 7) == 0) &&
         (uVar12 = (ulong)((uint)(uVar10 >> 3) & 1), (long)uVar11 <= (long)uVar12)) {
        uVar12 = uVar11;
      }
      lVar6 = uVar11 - uVar12;
      if (0 < (long)uVar12) {
        uVar5 = 0;
        do {
          *(double *)(uVar10 + uVar5 * 8) =
               local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar12 != uVar5);
      }
      uVar5 = (lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      if (1 < lVar6) {
        do {
          dVar3 = (local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data + uVar12)[1];
          pdVar2 = (double *)(uVar10 + uVar12 * 8);
          *pdVar2 = local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[uVar12];
          pdVar2[1] = dVar3;
          uVar12 = uVar12 + 2;
        } while ((long)uVar12 < (long)uVar5);
      }
      if ((long)uVar5 < (long)uVar11) {
        do {
          *(double *)(uVar10 + uVar5 * 8) =
               local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
      }
      free(local_198.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          );
      this->m_measurement_updated = false;
      iDynTree::VectorDynSize::~VectorDynSize(local_d8);
      return true;
    }
    pcVar13 = "measurements not updated.";
  }
  iDynTree::reportError("DiscreteExtendedKalmanFilterHelper","ekfUpdate",pcVar13);
  return false;
}

Assistant:

bool iDynTree::DiscreteExtendedKalmanFilterHelper::ekfUpdate()
{
    if (!m_is_initialized)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfUpdate", "filter not initialized.");
        return false;
    }

    if (!m_initial_state_set)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfUpdate", "initial state not set.");
        return false;
    }

    if (!m_initial_state_covariance_set)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfUpdate", "initial state covariance not set.");
        return false;
    }

    if (!m_measurement_updated)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "ekfUpdate", "measurements not updated.");
        return false;
    }

    iDynTree::VectorDynSize z;
    z.resize(m_dim_Y);
    ekf_h(m_xhat, z);                             ///< \f$ z_{k+1} = h(\hat{x}_{k+1}) \f$
    ekfComputeJacobianH(m_xhat, m_H);            ///< \f$ H \mid_{x = \hat{x}_{k+1}} \f$

    using iDynTree::toEigen;
    auto P(toEigen(m_P));
    auto Phat(toEigen(m_Phat));
    auto S(toEigen(m_S));
    auto K(toEigen(m_K));
    auto H(toEigen(m_H));
    auto R(toEigen(m_R));
    auto x(toEigen(m_x));
    auto xhat(toEigen(m_xhat));
    auto y(toEigen(m_y) - toEigen(z));        ///< innovation \f$ \tilde{y}_{k+1} = y_{k+1} - z_{k+1} \f$

    S = H*Phat*(H.transpose()) + R;             ///< \f$ S_{k+1} = H_{k+1} \hat{P}_{k+1} H_{k+1}^T + R \f$
    K = Phat*(H.transpose())*(S.inverse());       ///< \f$ K_{k+1} = \hat{P}_{k+1} H_{k+1}^T S_{k+1}^{-1} \f$
    P = Phat - (K*H*Phat);                    ///< \f$ P_{k+1} = \hat{P}_{k+1} - (K_{k+1} H \hat{P}_{k+1}) \f$
    x = xhat + K*y;                           ///< \f$ x_{k+1} = \hat{x}_{k+1} + K_{k+1} \tilde{y}_{k+1} \f$

    m_measurement_updated = false;
    return true;
}